

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

EVaction INT_EVassoc_mutated_multi_action
                   (CManager_conflict cm,EVstone stone_id,EVaction act_num,EVMultiHandlerFunc func,
                   void *client_data,FMFormat *reference_formats,int_free_func free_func)

{
  int iVar1;
  event_path_data evp;
  int iVar2;
  action_class aVar3;
  int iVar4;
  stone_type stone;
  FMFormat *pp_Var5;
  response_cache_element *prVar6;
  char *__ptr;
  long lVar7;
  FILE *__stream;
  FMFormat p_Var8;
  long lVar9;
  
  evp = cm->evp;
  stone = stone_struct(evp,stone_id);
  iVar1 = stone->response_cache_count;
  lVar9 = 1;
  pp_Var5 = reference_formats;
  do {
    lVar9 = lVar9 + -1;
    p_Var8 = *pp_Var5;
    pp_Var5 = pp_Var5 + 1;
  } while (p_Var8 != (FMFormat)0x0);
  prVar6 = (response_cache_element *)
           INT_CMrealloc(stone->response_cache,(long)(iVar1 - (int)lVar9) * 0x30);
  stone->response_cache = prVar6;
  __stream = (FILE *)cm->CMTrace_file;
  if (__stream == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,EVerbose);
    if (iVar2 == 0) goto LAB_0012fb42;
    __stream = (FILE *)cm->CMTrace_file;
  }
  else if (CMtrace_val[10] == 0) goto LAB_0012fb42;
  fprintf(__stream,"Installing %d mutated action responses for multi action %d on ",-lVar9,
          (ulong)(uint)act_num);
  fprint_stone_identifier(cm->CMTrace_file,evp,stone_id);
  fputc(10,(FILE *)cm->CMTrace_file);
LAB_0012fb42:
  lVar7 = 0;
  do {
    if (-lVar9 == lVar7) {
      stone->response_cache_count = stone->response_cache_count - (int)lVar9;
      fix_response_cache(stone);
      return iVar1;
    }
    iVar2 = stone->response_cache_count + (int)lVar7;
    prVar6 = stone->response_cache;
    prVar6[iVar2].action_type = stone->proto_actions[act_num].action_type;
    prVar6[iVar2].requires_decoded = 1;
    prVar6[iVar2].proto_action_id = act_num;
    prVar6[iVar2].o.multi.handler = func;
    prVar6[iVar2].o.imm.client_data = client_data;
    prVar6[iVar2].o.imm.free_func = free_func;
    aVar3 = cached_stage_for_action(stone->proto_actions + act_num);
    prVar6[iVar2].stage = aVar3;
    p_Var8 = reference_formats[lVar7];
    prVar6[iVar2].reference_format = p_Var8;
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
      if (iVar4 != 0) {
        p_Var8 = prVar6[iVar2].reference_format;
        goto LAB_0012fc04;
      }
    }
    else if (CMtrace_val[10] != 0) {
LAB_0012fc04:
      if (p_Var8 == (FMFormat)0x0) {
        __ptr = strdup("<none>");
        p_Var8 = (FMFormat)0x0;
      }
      else {
        __ptr = (char *)global_name_of_FMFormat();
        p_Var8 = prVar6[iVar2].reference_format;
      }
      fprintf((FILE *)cm->CMTrace_file,"\tResponse %d for format \"%s\"(%p)\n",
              (ulong)(uint)(stone->response_cache_count + (int)lVar7),__ptr,p_Var8);
      free(__ptr);
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

extern EVaction
INT_EVassoc_mutated_multi_action(CManager cm, EVstone stone_id, EVaction act_num,
				  EVMultiHandlerFunc func, void *client_data, 
				 FMFormat *reference_formats, int_free_func free_func)
{
#ifdef HAVE_COD_H
    event_path_data evp = cm->evp;
    stone_type stone;
    int resp_num;
    int queue_count = 0, i;

    stone = stone_struct(evp, stone_id);
    resp_num = stone->response_cache_count;
    while (reference_formats[queue_count] != NULL) queue_count++;
    stone->response_cache = realloc(stone->response_cache, sizeof(stone->response_cache[0]) * (resp_num + queue_count));
    response_cache_element *resp;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Installing %d mutated action responses for multi action %d on ",
		queue_count, act_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_id);
	fprintf(cm->CMTrace_file, "\n");
    }
    for (i=0; i < queue_count; i++) {
	resp = &stone->response_cache[stone->response_cache_count + i];
	resp->action_type = stone->proto_actions[act_num].action_type;
	resp->requires_decoded = 1;
	resp->proto_action_id = act_num;
	resp->o.multi.handler = func;
	resp->o.multi.client_data = client_data;
	resp->o.multi.free_func = free_func;
        resp->stage = cached_stage_for_action(&stone->proto_actions[act_num]);
	resp->reference_format = reference_formats[i];
	if (CMtrace_on(cm, EVerbose)) {
	    char *tmp;
	    if (resp->reference_format) {
		tmp = global_name_of_FMFormat(resp->reference_format);
	    } else {
		tmp = strdup("<none>");
	    }
	    fprintf(cm->CMTrace_file, "\tResponse %d for format \"%s\"(%p)\n", stone->response_cache_count+i, tmp, resp->reference_format);
	    free(tmp);
	}
    }
    stone->response_cache_count += queue_count;
    fix_response_cache(stone);
    return resp_num;
#else
    fprintf(stderr, "No code generation in FFS, action unavailable\n");
    return -1;
#endif    
}